

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O1

bool __thiscall cmCTestSVN::InfoParser::ProcessLine(InfoParser *this)

{
  char *pcVar1;
  bool bVar2;
  string *this_00;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 local_18;
  undefined7 uStack_17;
  
  bVar2 = cmsys::RegularExpression::find
                    (&this->RegexRev,(this->super_LineParser).Line._M_dataplus._M_p,
                     &(this->RegexRev).regmatch);
  if (bVar2) {
    pcVar1 = (this->RegexRev).regmatch.startp[1];
    if (pcVar1 == (char *)0x0) {
      local_28 = &local_18;
      local_20 = 0;
      local_18 = 0;
    }
    else {
      local_28 = &local_18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_28,pcVar1,(this->RegexRev).regmatch.endp[1]);
    }
    this_00 = this->Rev;
  }
  else {
    bVar2 = cmsys::RegularExpression::find
                      (&this->RegexURL,(this->super_LineParser).Line._M_dataplus._M_p,
                       &(this->RegexURL).regmatch);
    if (bVar2) {
      pcVar1 = (this->RegexURL).regmatch.startp[1];
      if (pcVar1 == (char *)0x0) {
        local_28 = &local_18;
        local_20 = 0;
        local_18 = 0;
      }
      else {
        local_28 = &local_18;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_28,pcVar1,(this->RegexURL).regmatch.endp[1]);
      }
      this_00 = &this->SVNRepo->URL;
    }
    else {
      bVar2 = cmsys::RegularExpression::find
                        (&this->RegexRoot,(this->super_LineParser).Line._M_dataplus._M_p,
                         &(this->RegexRoot).regmatch);
      if (!bVar2) {
        return true;
      }
      pcVar1 = (this->RegexRoot).regmatch.startp[1];
      if (pcVar1 == (char *)0x0) {
        local_28 = &local_18;
        local_20 = 0;
        local_18 = 0;
      }
      else {
        local_28 = &local_18;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_28,pcVar1,(this->RegexRoot).regmatch.endp[1]);
      }
      this_00 = &this->SVNRepo->Root;
    }
  }
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_28);
  if (local_28 != &local_18) {
    operator_delete(local_28,CONCAT71(uStack_17,local_18) + 1);
  }
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (this->RegexRev.find(this->Line)) {
      this->Rev = this->RegexRev.match(1);
    } else if (this->RegexURL.find(this->Line)) {
      this->SVNRepo.URL = this->RegexURL.match(1);
    } else if (this->RegexRoot.find(this->Line)) {
      this->SVNRepo.Root = this->RegexRoot.match(1);
    }
    return true;
  }